

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ta_frame.c
# Opt level: O0

TA_RetCode
TA_CMO_FramePP(TA_ParamHolderPriv *params,int startIdx,int endIdx,int *outBegIdx,int *outNBElement)

{
  TA_RetCode TVar1;
  int *in_stack_00000028;
  int *in_stack_00000030;
  int in_stack_0000003c;
  double *in_stack_00000040;
  int in_stack_0000004c;
  int in_stack_00000050;
  double *in_stack_00000060;
  
  TVar1 = TA_CMO(in_stack_00000050,in_stack_0000004c,in_stack_00000040,in_stack_0000003c,
                 in_stack_00000030,in_stack_00000028,in_stack_00000060);
  return TVar1;
}

Assistant:

TA_RetCode TA_CMO_FramePP( const TA_ParamHolderPriv *params,
/* Generated */                           int            startIdx,
/* Generated */                           int            endIdx,
/* Generated */                           int           *outBegIdx,
/* Generated */                           int           *outNBElement )
/* Generated */ {
/* Generated */    return TA_CMO(
/* Generated */             startIdx,
/* Generated */             endIdx,
/* Generated */             params->in[0].data.inReal, /* inReal */
/* Generated */             params->optIn[0].data.optInInteger, /* optInTimePeriod*/
/* Generated */             outBegIdx, 
/* Generated */             outNBElement, 
/* Generated */             params->out[0].data.outReal /*  outReal */ );
/* Generated */ }